

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

io_context * gmlc::networking::AsioContextManager::getExistingContext(string *contextName)

{
  bool bVar1;
  io_context *piVar2;
  invalid_argument *this;
  string *in_stack_00000008;
  shared_ptr<gmlc::networking::AsioContextManager> ptr;
  __shared_ptr local_18 [24];
  
  getExistingContextPointer(in_stack_00000008);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (!bVar1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"the context name specified was not available");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6e36f2);
  piVar2 = getBaseContext((AsioContextManager *)0x6e36fa);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x6e370b);
  return piVar2;
}

Assistant:

asio::io_context&
    AsioContextManager::getExistingContext(const std::string& contextName)
{
    auto ptr = getExistingContextPointer(contextName);
    if (ptr) {
        return ptr->getBaseContext();
    }
    throw(
        std::invalid_argument("the context name specified was not available"));
}